

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.cpp
# Opt level: O0

size_t __thiscall StackBackTrace::Print(StackBackTrace *this)

{
  void *__ptr;
  size_t sVar1;
  uint local_24;
  ULONG i;
  char **f;
  size_t retValue;
  StackBackTrace *this_local;
  
  f = (char **)0x0;
  __ptr = (void *)backtrace_symbols(this + 1,this->framesCount);
  if (__ptr != (void *)0x0) {
    for (local_24 = 0; local_24 < this->framesCount; local_24 = local_24 + 1) {
      sVar1 = Output::Print(L" %S\n",*(undefined8 *)((long)__ptr + (ulong)local_24 * 8));
      f = (char **)(sVar1 + (long)f);
    }
    ::free(__ptr);
  }
  sVar1 = Output::Print(L"\n");
  return sVar1 + (long)f;
}

Assistant:

size_t
StackBackTrace::Print()
{
    size_t retValue = 0;

#ifdef DBGHELP_SYMBOL_MANAGER
    DbgHelpSymbolManager::EnsureInitialized();

    for(ULONG i = 0; i < this->framesCount; i++)
    {
        PVOID address = this->stackBackTrace[i];
        retValue += Output::Print(_u(" "));
        retValue += DbgHelpSymbolManager::PrintSymbol(address);
        retValue += Output::Print(_u("\n"));
    }
#else
    char** f = backtrace_symbols(this->stackBackTrace, this->framesCount);
    if (f)
    {
        for (ULONG i = 0; i < this->framesCount; i++)
        {
            retValue += Output::Print(_u(" %S\n"), f[i]);
        }
        free(f);
    }
#endif

    retValue += Output::Print(_u("\n"));
    return retValue;
}